

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::RowSingletonPS::RowSingletonPS
          (RowSingletonPS *this,
          SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *lp,int _i,int _j,bool strictLo,bool strictUp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *newLo,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newUp,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *oldLo,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *oldUp,shared_ptr<soplex::Tolerances> *tols)

{
  int iVar1;
  SPxSense SVar2;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  undefined8 *in_RDI;
  byte in_R8B;
  byte in_R9B;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe70;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  undefined8 in_stack_fffffffffffffe78;
  shared_ptr<soplex::Tolerances> *in_stack_fffffffffffffe80;
  undefined8 *puVar3;
  char *in_stack_fffffffffffffe88;
  PostStep *in_stack_fffffffffffffe90;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_104;
  byte local_aa;
  byte local_a9;
  undefined4 local_a8;
  undefined4 local_a4;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  long local_88;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_80;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_78;
  undefined8 *local_68;
  undefined8 *local_58;
  undefined8 *local_48;
  undefined8 *local_38;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_29;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_28;
  undefined8 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_a9 = in_R8B & 1;
  local_aa = in_R9B & 1;
  local_a8 = in_ECX;
  local_a4 = in_EDX;
  local_a0 = in_RSI;
  std::shared_ptr<soplex::Tolerances>::shared_ptr
            ((shared_ptr<soplex::Tolerances> *)in_stack_fffffffffffffe70,
             (shared_ptr<soplex::Tolerances> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x42c50b);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::nCols((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)0x42c521);
  PostStep::PostStep(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                     (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78)
  ;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x42c55e);
  *in_RDI = &PTR__RowSingletonPS_004f09e0;
  *(undefined4 *)(in_RDI + 5) = local_a4;
  iVar1 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::nRows((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x42c594);
  *(int *)((long)in_RDI + 0x2c) = iVar1 + -1;
  *(undefined4 *)(in_RDI + 6) = local_a8;
  local_90 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::lhs(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  local_88 = (long)in_RDI + 0x34;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe70,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  this_00 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)((long)in_RDI + 0x6c);
  local_80 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::rhs(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  local_78 = this_00;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe70,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  *(byte *)((long)in_RDI + 0xa4) = local_a9 & 1;
  *(byte *)((long)in_RDI + 0xa5) = local_aa & 1;
  SVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(local_a0);
  *(bool *)((long)in_RDI + 0xa6) = SVar2 == MAXIMIZE;
  puVar3 = in_RDI + 0x15;
  SVar2 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::spxSense(local_a0);
  iVar1 = (int)((ulong)puVar3 >> 0x20);
  if (SVar2 == MINIMIZE) {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(this_00,iVar1);
    iVar1 = (int)((ulong)puVar3 >> 0x20);
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj(this_00,iVar1);
    local_28 = &local_104;
    local_20 = puVar3;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_29,local_28);
    local_18 = local_28;
    local_10 = puVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe70,
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_8 = puVar3;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::negate
              ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffffe70);
    iVar1 = (int)((ulong)puVar3 >> 0x20);
  }
  this_01 = (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)(in_RDI + 0x1c);
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::colVector(this_01,in_stack_fffffffffffffe6c);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
  ::
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_01,
             (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_68 = in_RDI + 0x20;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_01,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_58 = in_RDI + 0x27;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_01,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_48 = in_RDI + 0x2e;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_01,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_38 = in_RDI + 0x35;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)this_01,
             (cpp_dec_float<50U,_int,_void> *)
             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::rowObj(this_00,iVar1);
  return;
}

Assistant:

RowSingletonPS(const SPxLPBase<R>& lp, int _i, int _j, bool strictLo, bool strictUp,
                     R newLo, R newUp, R oldLo, R oldUp, std::shared_ptr<Tolerances> tols)
         : PostStep("RowSingleton", tols, lp.nRows(), lp.nCols())
         , m_i(_i)
         , m_old_i(lp.nRows() - 1)
         , m_j(_j)
         , m_lhs(lp.lhs(_i))
         , m_rhs(lp.rhs(_i))
         , m_strictLo(strictLo)
         , m_strictUp(strictUp)
         , m_maxSense(lp.spxSense() == SPxLPBase<R>::MAXIMIZE)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_col(lp.colVector(_j))
         , m_newLo(newLo)
         , m_newUp(newUp)
         , m_oldLo(oldLo)
         , m_oldUp(oldUp)
         , m_row_obj(lp.rowObj(_i))
      {}